

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int init_winzip_aes_encryption(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  char *__s;
  size_t pw_len;
  uint8_t local_a8 [4];
  int ret;
  uint8_t derived_key [66];
  uint8_t local_58 [8];
  uint8_t salt [18];
  size_t local_38;
  size_t salt_len;
  size_t key_len;
  char *passphrase;
  zip_conflict *zip;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  __s = __archive_write_get_passphrase(a);
  if (__s == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Encryption needs passphrase");
    a_local._4_4_ = -0x19;
  }
  else {
    if (*(int *)((long)pvVar1 + 0x40) == 2) {
      local_38 = 8;
      salt_len = 0x10;
    }
    else {
      local_38 = 0x10;
      salt_len = 0x20;
    }
    iVar2 = archive_random(local_58,local_38);
    if (iVar2 == 0) {
      pw_len = strlen(__s);
      pbkdf2_sha1(__s,pw_len,local_58,local_38,1000,local_a8,salt_len * 2 + 2);
      iVar2 = aes_ctr_init((archive_crypto_ctx *)((long)pvVar1 + 0x60),local_a8,salt_len);
      if (iVar2 == 0) {
        iVar2 = __hmac_sha1_init((archive_hmac_sha1_ctx *)((long)pvVar1 + 0xc0),local_a8 + salt_len,
                                 salt_len);
        if (iVar2 == 0) {
          local_58[local_38] = local_a8[salt_len * 2];
          local_58[local_38 + 1] = local_a8[salt_len * 2 + 1];
          a_local._4_4_ = __archive_write_output(a,local_58,local_38 + 2);
          if (a_local._4_4_ == 0) {
            *(size_t *)((long)pvVar1 + 0x108) = local_38 + 2 + *(long *)((long)pvVar1 + 0x108);
            *(size_t *)((long)pvVar1 + 0x18) = local_38 + 2 + *(long *)((long)pvVar1 + 0x18);
            a_local._4_4_ = 0;
          }
        }
        else {
          aes_ctr_release((archive_crypto_ctx *)((long)pvVar1 + 0x60));
          archive_set_error(&a->archive,-1,"Failed to initialize HMAC-SHA1");
          a_local._4_4_ = -0x19;
        }
      }
      else {
        archive_set_error(&a->archive,-1,"Decryption is unsupported due to lack of crypto library");
        a_local._4_4_ = -0x19;
      }
    }
    else {
      archive_set_error(&a->archive,-1,"Can\'t generate random number for encryption");
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
init_winzip_aes_encryption(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	const char *passphrase;
	size_t key_len, salt_len;
	uint8_t salt[16 + 2];
	uint8_t derived_key[MAX_DERIVED_KEY_BUF_SIZE];
	int ret;

	passphrase = __archive_write_get_passphrase(a);
	if (passphrase == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Encryption needs passphrase");
		return (ARCHIVE_FAILED);
	}
	if (zip->entry_encryption == ENCRYPTION_WINZIP_AES128) {
		salt_len = 8;
		key_len = 16;
	} else {
		/* AES 256 */
		salt_len = 16;
		key_len = 32;
	}
	if (archive_random(salt, salt_len) != ARCHIVE_OK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't generate random number for encryption");
		return (ARCHIVE_FATAL);
	}
	archive_pbkdf2_sha1(passphrase, strlen(passphrase),
	    salt, salt_len, 1000, derived_key, key_len * 2 + 2);

	ret = archive_encrypto_aes_ctr_init(&zip->cctx, derived_key, key_len);
	if (ret != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Decryption is unsupported due to lack of crypto library");
		return (ARCHIVE_FAILED);
	}
	ret = archive_hmac_sha1_init(&zip->hctx, derived_key + key_len,
	    key_len);
	if (ret != 0) {
		archive_encrypto_aes_ctr_release(&zip->cctx);
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to initialize HMAC-SHA1");
		return (ARCHIVE_FAILED);
        }

	/* Set a password verification value after the 'salt'. */
	salt[salt_len] = derived_key[key_len * 2];
	salt[salt_len + 1] = derived_key[key_len * 2 + 1];

	/* Write encrypted keys in the top of the file content. */
	ret = __archive_write_output(a, salt, salt_len + 2);
	if (ret != ARCHIVE_OK)
		return (ret);
	zip->written_bytes += salt_len + 2;
	zip->entry_compressed_written += salt_len + 2;

	return (ARCHIVE_OK);
}